

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::PipelineApiCase::iterate(PipelineApiCase *this)

{
  pointer *this_00;
  TestLog *pTVar1;
  RenderContext *renderCtx;
  GLboolean GVar2;
  int iVar3;
  GLenum GVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  GLSLVersion glslVersion;
  int i;
  long lVar7;
  int i_1;
  GLuint value;
  GLuint pipelines [10];
  allocator<char> local_306;
  allocator<char> local_305;
  GLint linkStatus;
  string frag;
  string vtx;
  string local_2c0;
  string local_2a0;
  ShaderProgram progVF;
  int separable;
  Functions *gl;
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  vtx._M_dataplus._M_p = (pointer)&vtx.field_2;
  vtx._M_string_length = 0;
  frag._M_dataplus._M_p = (pointer)&frag.field_2;
  frag._M_string_length = 0;
  vtx.field_2._M_local_buf[0] = '\0';
  frag.field_2._M_local_buf[0] = '\0';
  generateBasicVertexSrc_abi_cxx11_
            ((string *)&progVF,(glcts *)(ulong)this->m_glslVersion,GLSL_VERSION_100_ES);
  std::__cxx11::string::operator=((string *)&vtx,(string *)&progVF);
  std::__cxx11::string::~string((string *)&progVF);
  generateBasicFragmentSrc_abi_cxx11_
            ((string *)&progVF,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::operator=((string *)&frag,(string *)&progVF);
  std::__cxx11::string::~string((string *)&progVF);
  this_00 = &progVF.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  progVF.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Begin:PipelineApiCase iterate");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&progVF,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,vtx._M_dataplus._M_p,&local_305);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,frag._M_dataplus._M_p,&local_306);
  glu::makeVtxFragSources((ProgramSources *)&separable,&local_2a0,&local_2c0);
  glu::ShaderProgram::ShaderProgram(&progVF,renderCtx,(ProgramSources *)&separable);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&separable);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  (*gl->programParameteri)(progVF.m_program.m_program,0x8258,1);
  (*gl->linkProgram)(progVF.m_program.m_program);
  (*gl->getProgramiv)(progVF.m_program.m_program,0x8b82,&linkStatus);
  if (linkStatus == 1) {
    (*gl->genProgramPipelines)(1,pipelines);
    (*gl->activeShaderProgram)(pipelines[0],progVF.m_program.m_program);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"ActiveShaderProgram failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                    ,0x3aa);
    (*gl->activeShaderProgram)(pipelines[0],progVF.m_program.m_program + 100);
    GVar4 = (*gl->getError)();
    if (GVar4 == 0x501) {
      (*gl->getProgramPipelineiv)(pipelines[0],0x8259,(GLint *)&value);
      if (value == progVF.m_program.m_program) {
        (*gl->deleteProgramPipelines)(1,pipelines);
        (*gl->activeShaderProgram)(pipelines[0],progVF.m_program.m_program);
        GVar4 = (*gl->getError)();
        if (GVar4 == 0x502) {
          (*gl->genProgramPipelines)(2,pipelines);
          (*gl->genProgramPipelines)(3,pipelines + 2);
          (*gl->genProgramPipelines)(5,pipelines + 5);
          lVar7 = 0;
          while (lVar7 != 10) {
            (*gl->bindProgramPipeline)(pipelines[lVar7]);
            GVar2 = (*gl->isProgramPipeline)(pipelines[lVar7]);
            lVar7 = lVar7 + 1;
            if (GVar2 == '\0') {
              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar6,"GenProgramPipelines failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                         ,0x3cf);
              __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
          }
          (*gl->deleteProgramPipelines)(10,pipelines);
          (*gl->genProgramPipelines)(2,pipelines);
          (*gl->bindProgramPipeline)(pipelines[0]);
          (*gl->getIntegerv)(0x825a,(GLint *)&value);
          if (value == pipelines[0]) {
            (*gl->bindProgramPipeline)(pipelines[1]);
            (*gl->getIntegerv)(0x825a,(GLint *)&value);
            if (value == pipelines[1]) {
              GVar4 = (*gl->getError)();
              glu::checkError(GVar4,"BindProgramPipeline failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                              ,0x3e3);
              (*gl->bindProgramPipeline)(pipelines[2]);
              (*gl->getIntegerv)(0x825a,(GLint *)&value);
              GVar4 = (*gl->getError)();
              if ((GVar4 == 0x502) && (value == pipelines[1])) {
                (*gl->genProgramPipelines)(8,pipelines + 2);
                (*gl->deleteProgramPipelines)(2,pipelines + 8);
                (*gl->deleteProgramPipelines)(3,pipelines + 5);
                pipelines[9] = 0;
                (*gl->deleteProgramPipelines)(10,pipelines);
                (*gl->deleteProgramPipelines)(0,pipelines);
                GVar4 = (*gl->getError)();
                glu::checkError(GVar4,"DeleteProgramPipelines failed",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                ,0x3f7);
                lVar7 = 0;
                while (lVar7 != 10) {
                  GVar2 = (*gl->isProgramPipeline)(pipelines[lVar7]);
                  lVar7 = lVar7 + 1;
                  if (GVar2 != '\0') {
                    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (pTVar6,"DeleteProgramPipelines failed",(char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                               ,0x3fc);
                    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                  }
                }
                (*gl->getIntegerv)(0x825a,(GLint *)&value);
                if (value == 0) {
                  pipelines[1] = 0x1000;
                  pipelines[2] = pipelines[2] + 100;
                  lVar7 = 0;
                  while (lVar7 != 3) {
                    GVar2 = (*gl->isProgramPipeline)(pipelines[lVar7]);
                    lVar7 = lVar7 + 1;
                    if (GVar2 != '\0') {
                      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar6,"IsProgramPipeline failed",(char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                 ,0x40e);
                      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                    }
                  }
                  (*gl->genProgramPipelines)(1,pipelines);
                  GVar2 = (*gl->isProgramPipeline)(pipelines[0]);
                  if (GVar2 == '\0') {
                    (*gl->deleteProgramPipelines)(1,pipelines);
                    GVar4 = (*gl->getError)();
                    glu::checkError(GVar4,"IsProgramPipeline failed",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                    ,0x417);
                    GVar5 = (*gl->createProgram)();
                    (*gl->programParameteri)(GVar5,0x8258,1);
                    (*gl->getProgramiv)(GVar5,0x8258,&separable);
                    if (separable == 0) {
                      (*gl->programParameteri)(GVar5,0x8258,0);
                      (*gl->getProgramiv)(GVar5,0x8258,&separable);
                      if (separable == 0) {
                        (*gl->deleteProgram)(GVar5);
                        (*gl->programParameteri)(GVar5,0x8258,1);
                        GVar4 = (*gl->getError)();
                        if (GVar4 == 0x501) {
                          (*gl->programParameteri)(progVF.m_program.m_program,0x8258,0x1f5);
                          GVar4 = (*gl->getError)();
                          if (GVar4 == 0x501) {
                            (*gl->genProgramPipelines)(1,pipelines);
                            (*gl->getProgramPipelineiv)(pipelines[0],0x8259,(GLint *)&value);
                            if (value == 0) {
                              (*gl->getProgramPipelineiv)(pipelines[0],0x8b31,(GLint *)&value);
                              if (value == 0) {
                                (*gl->getProgramPipelineiv)(pipelines[0],0x8b30,(GLint *)&value);
                                if (value == 0) {
                                  (*gl->getProgramPipelineiv)(pipelines[0],0x8b83,(GLint *)&value);
                                  if (value == 0) {
                                    (*gl->getProgramPipelineiv)(pipelines[0],0x8b84,(GLint *)&value)
                                    ;
                                    if (value == 0) {
                                      GVar4 = (*gl->getError)();
                                      glu::checkError(GVar4,"GetProgramPipelineiv failed",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x45b);
                                      (*gl->deleteProgramPipelines)(1,pipelines);
                                      (*gl->getProgramPipelineiv)
                                                (pipelines[0],0x8259,(GLint *)&value);
                                      GVar4 = (*gl->getError)();
                                      if (GVar4 == 0x502) {
                                        (*gl->genProgramPipelines)(1,pipelines);
                                        (*gl->getProgramPipelineiv)
                                                  (pipelines[0],0x8b83,(GLint *)&value);
                                        if (value == 0) {
                                          (*gl->validateProgramPipeline)(pipelines[0]);
                                          (*gl->getProgramPipelineiv)
                                                    (pipelines[0],0x8b83,(GLint *)&value);
                                          if (value == 0) {
                                            (*gl->bindProgramPipeline)(pipelines[0]);
                                            (*gl->validateProgramPipeline)(pipelines[0]);
                                            (*gl->getProgramPipelineiv)
                                                      (pipelines[0],0x8b83,(GLint *)&value);
                                            if (value == 0) {
                                              (*gl->useProgramStages)
                                                        (pipelines[0],3,progVF.m_program.m_program);
                                              (*gl->validateProgramPipeline)(pipelines[0]);
                                              (*gl->getProgramPipelineiv)
                                                        (pipelines[0],0x8b83,(GLint *)&value);
                                              if (value == 1) {
                                                checkProgInfoLog(this,gl,pipelines[0]);
                                                (*gl->programParameteri)
                                                          (progVF.m_program.m_program,0x8258,0);
                                                (*gl->linkProgram)(progVF.m_program.m_program);
                                                (*gl->getError)();
                                                (*gl->validateProgramPipeline)(pipelines[0]);
                                                (*gl->getProgramPipelineiv)
                                                          (pipelines[0],0x8b83,(GLint *)&value);
                                                if (value == 0) {
                                                  GVar4 = (*gl->getError)();
                                                  glu::checkError(GVar4,
                                                  "ValidateProgramPipeline failed",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x496);
                                                  checkProgInfoLog(this,gl,pipelines[0]);
                                                  (*gl->deleteProgramPipelines)(1,pipelines);
                                                  (*gl->validateProgramPipeline)(pipelines[0]);
                                                  GVar4 = (*gl->getError)();
                                                  if (GVar4 == 0x502) {
                                                    tcu::TestContext::setTestResult
                                                              ((this->super_TestCase).super_TestCase
                                                               .super_TestNode.m_testCtx,
                                                               QP_TEST_RESULT_PASS,"Pass");
                                                    glu::ShaderProgram::~ShaderProgram(&progVF);
                                                    std::__cxx11::string::~string((string *)&frag);
                                                    std::__cxx11::string::~string((string *)&vtx);
                                                    return STOP;
                                                  }
                                                  pTVar6 = (TestError *)
                                                           __cxa_allocate_exception(0x38);
                                                  tcu::TestError::TestError
                                                            (pTVar6,"ValidateProgramPipeline failed"
                                                             ,(char *)0x0,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x4a2);
                                                }
                                                else {
                                                  pTVar6 = (TestError *)
                                                           __cxa_allocate_exception(0x38);
                                                  tcu::TestError::TestError
                                                            (pTVar6,"ValidateProgramPipeline failed"
                                                             ,(char *)0x0,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x494);
                                                }
                                              }
                                              else {
                                                pTVar6 = (TestError *)__cxa_allocate_exception(0x38)
                                                ;
                                                tcu::TestError::TestError
                                                          (pTVar6,"ValidateProgramPipeline failed",
                                                           (char *)0x0,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x485);
                                              }
                                            }
                                            else {
                                              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                                              tcu::TestError::TestError
                                                        (pTVar6,
                                                  "ValidateProgramPipeline failed with empty program pipeline"
                                                  ,(char *)0x0,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x47d);
                                            }
                                          }
                                          else {
                                            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                                            tcu::TestError::TestError
                                                      (pTVar6,"ValidateProgramPipeline failed",
                                                       (char *)0x0,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x474);
                                          }
                                        }
                                        else {
                                          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                                          tcu::TestError::TestError
                                                    (pTVar6,"ValidateProgramPipeline failed",
                                                     (char *)0x0,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x46d);
                                        }
                                      }
                                      else {
                                        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                                        tcu::TestError::TestError
                                                  (pTVar6,
                                                  "GetProgramPipelineiv failed for ACTIVE_PROGRAM",
                                                  (char *)0x0,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x464);
                                      }
                                    }
                                    else {
                                      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                                      tcu::TestError::TestError
                                                (pTVar6,
                                                 "GetProgramPipelineiv failed for INFO_LOG_LENGTH",
                                                 (char *)0x0,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                 ,0x459);
                                    }
                                  }
                                  else {
                                    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                                    tcu::TestError::TestError
                                              (pTVar6,
                                               "GetProgramPipelineiv failed for VALIDATE_STATUS",
                                               (char *)0x0,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                               ,0x454);
                                  }
                                }
                                else {
                                  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                                  tcu::TestError::TestError
                                            (pTVar6,
                                             "GetProgramPipelineiv failed for FRAGMENT_SHADER",
                                             (char *)0x0,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                             ,0x44f);
                                }
                              }
                              else {
                                pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                                tcu::TestError::TestError
                                          (pTVar6,"GetProgramPipelineiv failed for VERTEX_SHADER",
                                           (char *)0x0,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                           ,0x44a);
                              }
                            }
                            else {
                              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                              tcu::TestError::TestError
                                        (pTVar6,"GetProgramPipelineiv failed for ACTIVE_PROGRAM",
                                         (char *)0x0,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                         ,0x445);
                            }
                          }
                          else {
                            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                            tcu::TestError::TestError
                                      (pTVar6,"programParameteri PROGRAM_SEPARABLE failed",
                                       (char *)0x0,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                       ,0x43c);
                          }
                        }
                        else {
                          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                          tcu::TestError::TestError
                                    (pTVar6,"programParameteri PROGRAM_SEPARABLE failed",(char *)0x0
                                     ,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                     ,0x436);
                        }
                      }
                      else {
                        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (pTVar6,"programParameteri PROGRAM_SEPARABLE failed",(char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                   ,0x42c);
                      }
                    }
                    else {
                      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar6,"programParameteri PROGRAM_SEPARABLE failed",(char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                 ,0x426);
                    }
                    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                  }
                  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar6,"IsProgramPipeline failed",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,0x414);
                }
                else {
                  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar6,"DeleteProgramPipelines failed",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,0x402);
                }
              }
              else {
                pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar6,"BindProgramPipeline failed",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                           ,0x3ec);
              }
            }
            else {
              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar6,"BindProgramPipeline failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                         ,0x3e1);
            }
          }
          else {
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,"BindProgramPipeline failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x3db);
          }
        }
        else {
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"ActiveShaderProgram failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0x3c1);
        }
      }
      else {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"ActiveShaderProgram failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x3b8);
      }
    }
    else {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"ActiveShaderProgram failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x3b3);
    }
  }
  else {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"LinkProgram failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x3a3);
  }
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		glw::GLenum			  err;
		const int			  maxpipelines = 10;
		glw::GLuint			  pipelines[maxpipelines];
		std::string			  vtx;
		std::string			  frag;
		glw::GLint			  linkStatus;
		glw::GLuint			  value;

		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		// Pipeline API verification
		log << TestLog::Message << "Begin:PipelineApiCase iterate" << TestLog::EndMessage;

		glu::ShaderProgram progVF(m_context.getRenderContext(), glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

		// Make separable and relink
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progVF.getProgram());
		gl.getProgramiv(progVF.getProgram(), GL_LINK_STATUS, &linkStatus);
		if (linkStatus != 1)
		{
			TCU_FAIL("LinkProgram failed");
		}

		gl.genProgramPipelines(1, pipelines);

		// ActiveShaderProgram
		gl.activeShaderProgram(pipelines[0], progVF.getProgram());
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveShaderProgram failed");

		// Negative cases for ActiveShaderProgram

		// Nonexistent program
		gl.activeShaderProgram(pipelines[0], progVF.getProgram() + 100);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("ActiveShaderProgram failed");
		}
		gl.getProgramPipelineiv(pipelines[0], GL_ACTIVE_PROGRAM, (glw::GLint*)&value);
		if (value != progVF.getProgram())
		{
			TCU_FAIL("ActiveShaderProgram failed");
		}

		// Deleted pipeline
		gl.deleteProgramPipelines(1, pipelines);
		gl.activeShaderProgram(pipelines[0], progVF.getProgram());
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("ActiveShaderProgram failed");
		}

		// GenProgramPipeline

		gl.genProgramPipelines(2, &pipelines[0]);
		gl.genProgramPipelines(3, &pipelines[2]);
		gl.genProgramPipelines(5, &pipelines[5]);

		for (int i = 0; i < maxpipelines; i++)
		{
			gl.bindProgramPipeline(pipelines[i]); // has to be bound to be recognized
			if (!gl.isProgramPipeline(pipelines[i]))
			{
				TCU_FAIL("GenProgramPipelines failed");
			}
		}
		gl.deleteProgramPipelines(maxpipelines, pipelines);

		// BindProgramPipeline

		gl.genProgramPipelines(2, pipelines);
		gl.bindProgramPipeline(pipelines[0]);
		gl.getIntegerv(GL_PROGRAM_PIPELINE_BINDING, (glw::GLint*)&value);
		if (value != pipelines[0])
		{
			TCU_FAIL("BindProgramPipeline failed");
		}
		gl.bindProgramPipeline(pipelines[1]);
		gl.getIntegerv(GL_PROGRAM_PIPELINE_BINDING, (glw::GLint*)&value);
		if (value != pipelines[1])
		{
			TCU_FAIL("BindProgramPipeline failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindProgramPipeline failed");

		// Negative Case for BindProgramPipeline

		gl.bindProgramPipeline(pipelines[2]); // deleted pipeline
		gl.getIntegerv(GL_PROGRAM_PIPELINE_BINDING, (glw::GLint*)&value);
		err = gl.getError();
		if ((err != GL_INVALID_OPERATION) || (value != pipelines[1]))
		{
			TCU_FAIL("BindProgramPipeline failed");
		}

		// DeleteProgramPipelines

		gl.genProgramPipelines(8, &pipelines[2]); // back to 10 total
		gl.deleteProgramPipelines(2, &pipelines[8]);
		gl.deleteProgramPipelines(3, &pipelines[5]);
		pipelines[9] = 0;
		gl.deleteProgramPipelines(maxpipelines, pipelines); // 5 good, 4 deleted, 1 zero
		gl.deleteProgramPipelines(0, pipelines);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DeleteProgramPipelines failed");
		for (int i = 0; i < maxpipelines; i++)
		{
			if (gl.isProgramPipeline(pipelines[i]))
			{
				TCU_FAIL("DeleteProgramPipelines failed");
			}
		}
		gl.getIntegerv(GL_PROGRAM_PIPELINE_BINDING, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("DeleteProgramPipelines failed");
		}

		// IsProgramPipeline

		pipelines[1] = 0x1000;
		pipelines[2] += 100;
		for (int i = 0; i < 3; i++)
		{
			// 1 deleted and 2 bogus values
			if (gl.isProgramPipeline(pipelines[i]))
			{
				TCU_FAIL("IsProgramPipeline failed");
			}
		}
		gl.genProgramPipelines(1, pipelines);
		if (gl.isProgramPipeline(pipelines[0]))
		{
			TCU_FAIL("IsProgramPipeline failed");
		}
		gl.deleteProgramPipelines(1, pipelines);
		GLU_EXPECT_NO_ERROR(gl.getError(), "IsProgramPipeline failed");

		// ProgramParameteri PROGRAM_SEPARABLE
		// NOTE: The query for PROGRAM_SEPARABLE must query latched
		//       state. In other words, the state of the binary after
		//       it was linked. So in the tests below, the queries
		//       should return the default state GL_FALSE since the
		//       program has no linked binary.

		glw::GLuint programSep = gl.createProgram();
		int			separable;
		gl.programParameteri(programSep, GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.getProgramiv(programSep, GL_PROGRAM_SEPARABLE, &separable);
		if (separable != GL_FALSE)
		{
			TCU_FAIL("programParameteri PROGRAM_SEPARABLE failed");
		}
		gl.programParameteri(programSep, GL_PROGRAM_SEPARABLE, GL_FALSE);
		gl.getProgramiv(programSep, GL_PROGRAM_SEPARABLE, &separable);
		if (separable != 0)
		{
			TCU_FAIL("programParameteri PROGRAM_SEPARABLE failed");
		}

		// Negative Case for ProgramParameteri PROGRAM_SEPARABLE

		gl.deleteProgram(programSep);
		gl.programParameteri(programSep, GL_PROGRAM_SEPARABLE, GL_TRUE);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("programParameteri PROGRAM_SEPARABLE failed");
		}
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, 501);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("programParameteri PROGRAM_SEPARABLE failed");
		}

		// GetProgramPipelineiv

		gl.genProgramPipelines(1, pipelines);
		gl.getProgramPipelineiv(pipelines[0], GL_ACTIVE_PROGRAM, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("GetProgramPipelineiv failed for ACTIVE_PROGRAM");
		}
		gl.getProgramPipelineiv(pipelines[0], GL_VERTEX_SHADER, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("GetProgramPipelineiv failed for VERTEX_SHADER");
		}
		gl.getProgramPipelineiv(pipelines[0], GL_FRAGMENT_SHADER, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("GetProgramPipelineiv failed for FRAGMENT_SHADER");
		}
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("GetProgramPipelineiv failed for VALIDATE_STATUS");
		}
		gl.getProgramPipelineiv(pipelines[0], GL_INFO_LOG_LENGTH, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("GetProgramPipelineiv failed for INFO_LOG_LENGTH");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramPipelineiv failed");

		// Negative Case for GetProgramPipelineiv

		gl.deleteProgramPipelines(1, pipelines);
		gl.getProgramPipelineiv(pipelines[0], GL_ACTIVE_PROGRAM, (glw::GLint*)&value);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("GetProgramPipelineiv failed for ACTIVE_PROGRAM");
		}

		// ValidateProgramPipeline

		gl.genProgramPipelines(1, pipelines); // Unvalidated
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("ValidateProgramPipeline failed");
		}

		gl.validateProgramPipeline(pipelines[0]); // Not bound yet
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("ValidateProgramPipeline failed");
		}

		gl.bindProgramPipeline(pipelines[0]);

		gl.validateProgramPipeline(pipelines[0]); // Still empty program pipeline.
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("ValidateProgramPipeline failed with empty program pipeline");
		}

		gl.useProgramStages(pipelines[0], GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progVF.getProgram());
		gl.validateProgramPipeline(pipelines[0]);
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 1)
		{
			TCU_FAIL("ValidateProgramPipeline failed");
		}

		// GetProgramPipelineInfoLog
		checkProgInfoLog(gl, pipelines[0]);

		// ValidateProgramPipeline additional
		// Relink the bound separable program as not separable
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_FALSE);
		gl.linkProgram(progVF.getProgram());
		err = gl.getError();
		gl.validateProgramPipeline(pipelines[0]);
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("ValidateProgramPipeline failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "ValidateProgramPipeline failed");

		// GetProgramPipelineInfoLog
		checkProgInfoLog(gl, pipelines[0]);

		// Negative Case for ValidateProgramPipeline

		gl.deleteProgramPipelines(1, pipelines);
		gl.validateProgramPipeline(pipelines[0]);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("ValidateProgramPipeline failed");
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}